

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O0

double __thiscall
pugi::impl::anon_unknown_0::xpath_ast_node::eval_number
          (xpath_ast_node *this,xpath_context *c,xpath_stack *stack)

{
  xpath_ast_node *pxVar1;
  char cVar2;
  xpath_node *pxVar3;
  bool bVar4;
  size_t sVar5;
  xpath_node *pxVar6;
  xpath_context *in_RDX;
  xpath_ast_node *in_RSI;
  undefined1 *in_RDI;
  double __y;
  double dVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  xpath_allocator_capture cr_6;
  xpath_allocator_capture cr_5;
  double r_2;
  double r_1;
  xpath_allocator_capture cri;
  xpath_node *it;
  xpath_node_set_raw ns;
  double r;
  xpath_allocator_capture cr_4;
  xpath_allocator_capture cr_3;
  xpath_allocator_capture cr_2;
  xpath_allocator_capture cr_1;
  xpath_allocator_capture cr;
  xpath_stack *in_stack_00000310;
  xpath_context *in_stack_00000318;
  xpath_ast_node *in_stack_00000320;
  char_t *in_stack_fffffffffffffd18;
  xpath_string *in_stack_fffffffffffffd20;
  double local_2b8;
  double local_2b0;
  xpath_allocator *in_stack_fffffffffffffdb8;
  xpath_node *in_stack_fffffffffffffdc0;
  xpath_string local_220;
  xpath_allocator_capture local_208;
  nodeset_eval_t in_stack_fffffffffffffe1c;
  xpath_stack *in_stack_fffffffffffffe20;
  xpath_context *in_stack_fffffffffffffe28;
  xpath_ast_node *in_stack_fffffffffffffe30;
  xpath_string local_1a0;
  xpath_allocator_capture local_188;
  xpath_node *local_168;
  xpath_node_set_raw local_160;
  double local_140;
  xpath_allocator_capture local_138;
  xpath_string local_118;
  xpath_allocator_capture local_100;
  xpath_allocator_capture local_c8;
  xpath_stack *in_stack_ffffffffffffff58;
  xpath_context *in_stack_ffffffffffffff60;
  xpath_ast_node *in_stack_ffffffffffffff68;
  xpath_allocator_capture local_90;
  xpath_node_set_raw local_60;
  xpath_stack *in_stack_ffffffffffffffd8;
  double local_8;
  
  switch(*in_RDI) {
  case 9:
    local_8 = eval_number(in_RSI,in_RDX,in_stack_ffffffffffffffd8);
    dVar7 = eval_number(in_RSI,in_RDX,in_stack_ffffffffffffffd8);
    local_8 = local_8 + dVar7;
    break;
  case 10:
    local_8 = eval_number(in_RSI,in_RDX,in_stack_ffffffffffffffd8);
    dVar7 = eval_number(in_RSI,in_RDX,in_stack_ffffffffffffffd8);
    local_8 = local_8 - dVar7;
    break;
  case 0xb:
    local_8 = eval_number(in_RSI,in_RDX,in_stack_ffffffffffffffd8);
    dVar7 = eval_number(in_RSI,in_RDX,in_stack_ffffffffffffffd8);
    local_8 = local_8 * dVar7;
    break;
  case 0xc:
    local_8 = eval_number(in_RSI,in_RDX,in_stack_ffffffffffffffd8);
    dVar7 = eval_number(in_RSI,in_RDX,in_stack_ffffffffffffffd8);
    local_8 = local_8 / dVar7;
    break;
  case 0xd:
    dVar7 = eval_number(in_RSI,in_RDX,in_stack_ffffffffffffffd8);
    __y = eval_number(in_RSI,in_RDX,in_stack_ffffffffffffffd8);
    local_8 = fmod(dVar7,__y);
    break;
  case 0xe:
    local_8 = eval_number(in_RSI,in_RDX,in_stack_ffffffffffffffd8);
    local_8 = -local_8;
    break;
  case 0x13:
    local_8 = *(double *)(in_RDI + 0x20);
    break;
  case 0x14:
    if (in_RDI[1] == '\x02') {
      dVar7 = xpath_variable::get_number((xpath_variable *)in_stack_fffffffffffffd20);
      return dVar7;
    }
  default:
    cVar2 = in_RDI[1];
    if (cVar2 == '\x01') {
      xpath_allocator_capture::xpath_allocator_capture
                (&local_208,(xpath_allocator *)(in_RDX->n)._node._root);
      eval_string(in_stack_00000320,in_stack_00000318,in_stack_00000310);
      xpath_string::c_str(&local_220);
      local_8 = convert_string_to_number(in_stack_fffffffffffffd18);
      xpath_allocator_capture::~xpath_allocator_capture((xpath_allocator_capture *)0x12b9cf);
    }
    else if (cVar2 == '\x03') {
      xpath_allocator_capture::xpath_allocator_capture
                ((xpath_allocator_capture *)&stack0xfffffffffffffe30,
                 (xpath_allocator *)(in_RDX->n)._node._root);
      eval_string(in_stack_00000320,in_stack_00000318,in_stack_00000310);
      xpath_string::c_str((xpath_string *)&stack0xfffffffffffffe18);
      local_8 = convert_string_to_number(in_stack_fffffffffffffd18);
      xpath_allocator_capture::~xpath_allocator_capture((xpath_allocator_capture *)0x12b923);
    }
    else if (cVar2 == '\x04') {
      bVar4 = eval_boolean(in_stack_ffffffffffffff68,in_stack_ffffffffffffff60,
                           in_stack_ffffffffffffff58);
      local_8 = (double)bVar4;
    }
    else {
      local_8 = 0.0;
    }
    break;
  case 0x15:
    pxVar1 = in_RSI->_next;
    auVar8._8_4_ = (int)((ulong)pxVar1 >> 0x20);
    auVar8._0_8_ = pxVar1;
    auVar8._12_4_ = 0x45300000;
    local_8 = (auVar8._8_8_ - 1.9342813113834067e+25) +
              ((double)CONCAT44(0x43300000,(int)pxVar1) - 4503599627370496.0);
    break;
  case 0x16:
    pxVar1 = in_RSI->_right;
    auVar9._8_4_ = (int)((ulong)pxVar1 >> 0x20);
    auVar9._0_8_ = pxVar1;
    auVar9._12_4_ = 0x45300000;
    local_8 = (auVar9._8_8_ - 1.9342813113834067e+25) +
              ((double)CONCAT44(0x43300000,(int)pxVar1) - 4503599627370496.0);
    break;
  case 0x17:
    xpath_allocator_capture::xpath_allocator_capture
              ((xpath_allocator_capture *)&stack0xffffffffffffffc0,
               (xpath_allocator *)(in_RDX->n)._node._root);
    eval_node_set(in_stack_fffffffffffffe30,in_stack_fffffffffffffe28,in_stack_fffffffffffffe20,
                  in_stack_fffffffffffffe1c);
    sVar5 = xpath_node_set_raw::size(&local_60);
    auVar10._8_4_ = (int)(sVar5 >> 0x20);
    auVar10._0_8_ = sVar5;
    auVar10._12_4_ = 0x45300000;
    local_8 = (auVar10._8_8_ - 1.9342813113834067e+25) +
              ((double)CONCAT44(0x43300000,(int)sVar5) - 4503599627370496.0);
    xpath_allocator_capture::~xpath_allocator_capture((xpath_allocator_capture *)0x12b29b);
    break;
  case 0x28:
    xpath_allocator_capture::xpath_allocator_capture
              (&local_90,(xpath_allocator *)(in_RDX->n)._node._root);
    string_value(in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8);
    sVar5 = xpath_string::length(in_stack_fffffffffffffd20);
    auVar11._8_4_ = (int)(sVar5 >> 0x20);
    auVar11._0_8_ = sVar5;
    auVar11._12_4_ = 0x45300000;
    local_8 = (auVar11._8_8_ - 1.9342813113834067e+25) +
              ((double)CONCAT44(0x43300000,(int)sVar5) - 4503599627370496.0);
    xpath_allocator_capture::~xpath_allocator_capture((xpath_allocator_capture *)0x12b35c);
    break;
  case 0x29:
    xpath_allocator_capture::xpath_allocator_capture
              (&local_c8,(xpath_allocator *)(in_RDX->n)._node._root);
    eval_string(in_stack_00000320,in_stack_00000318,in_stack_00000310);
    sVar5 = xpath_string::length(in_stack_fffffffffffffd20);
    auVar12._8_4_ = (int)(sVar5 >> 0x20);
    auVar12._0_8_ = sVar5;
    auVar12._12_4_ = 0x45300000;
    local_8 = (auVar12._8_8_ - 1.9342813113834067e+25) +
              ((double)CONCAT44(0x43300000,(int)sVar5) - 4503599627370496.0);
    xpath_allocator_capture::~xpath_allocator_capture((xpath_allocator_capture *)0x12b420);
    break;
  case 0x32:
    xpath_allocator_capture::xpath_allocator_capture
              (&local_100,(xpath_allocator *)(in_RDX->n)._node._root);
    string_value(in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8);
    xpath_string::c_str(&local_118);
    local_8 = convert_string_to_number(in_stack_fffffffffffffd18);
    xpath_allocator_capture::~xpath_allocator_capture((xpath_allocator_capture *)0x12b4c7);
    break;
  case 0x33:
    local_8 = eval_number(in_RSI,in_RDX,in_stack_ffffffffffffffd8);
    break;
  case 0x34:
    xpath_allocator_capture::xpath_allocator_capture
              (&local_138,(xpath_allocator *)(in_RDX->n)._node._root);
    local_140 = 0.0;
    eval_node_set(in_stack_fffffffffffffe30,in_stack_fffffffffffffe28,in_stack_fffffffffffffe20,
                  in_stack_fffffffffffffe1c);
    for (local_168 = xpath_node_set_raw::begin(&local_160); pxVar3 = local_168,
        pxVar6 = xpath_node_set_raw::end(&local_160), pxVar3 != pxVar6; local_168 = local_168 + 1) {
      xpath_allocator_capture::xpath_allocator_capture
                (&local_188,(xpath_allocator *)(in_RDX->n)._node._root);
      string_value(in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8);
      xpath_string::c_str(&local_1a0);
      dVar7 = convert_string_to_number(in_stack_fffffffffffffd18);
      local_140 = dVar7 + local_140;
      xpath_allocator_capture::~xpath_allocator_capture((xpath_allocator_capture *)0x12b64f);
    }
    local_8 = local_140;
    xpath_allocator_capture::~xpath_allocator_capture((xpath_allocator_capture *)0x12b6c0);
    break;
  case 0x35:
    local_2b0 = eval_number(in_RSI,in_RDX,in_stack_ffffffffffffffd8);
    if (!NAN(local_2b0)) {
      local_2b0 = floor(local_2b0);
    }
    local_8 = local_2b0;
    break;
  case 0x36:
    local_2b8 = eval_number(in_RSI,in_RDX,in_stack_ffffffffffffffd8);
    if (!NAN(local_2b8)) {
      local_2b8 = ceil(local_2b8);
    }
    local_8 = local_2b8;
    break;
  case 0x37:
    eval_number(in_RSI,in_RDX,in_stack_ffffffffffffffd8);
    local_8 = round_nearest_nzero((double)in_stack_fffffffffffffd20);
  }
  return local_8;
}

Assistant:

double eval_number(const xpath_context& c, const xpath_stack& stack)
		{
			switch (_type)
			{
			case ast_op_add:
				return _left->eval_number(c, stack) + _right->eval_number(c, stack);

			case ast_op_subtract:
				return _left->eval_number(c, stack) - _right->eval_number(c, stack);

			case ast_op_multiply:
				return _left->eval_number(c, stack) * _right->eval_number(c, stack);

			case ast_op_divide:
				return _left->eval_number(c, stack) / _right->eval_number(c, stack);

			case ast_op_mod:
				return fmod(_left->eval_number(c, stack), _right->eval_number(c, stack));

			case ast_op_negate:
				return -_left->eval_number(c, stack);

			case ast_number_constant:
				return _data.number;

			case ast_func_last:
				return static_cast<double>(c.size);

			case ast_func_position:
				return static_cast<double>(c.position);

			case ast_func_count:
			{
				xpath_allocator_capture cr(stack.result);

				return static_cast<double>(_left->eval_node_set(c, stack, nodeset_eval_all).size());
			}

			case ast_func_string_length_0:
			{
				xpath_allocator_capture cr(stack.result);

				return static_cast<double>(string_value(c.n, stack.result).length());
			}

			case ast_func_string_length_1:
			{
				xpath_allocator_capture cr(stack.result);

				return static_cast<double>(_left->eval_string(c, stack).length());
			}

			case ast_func_number_0:
			{
				xpath_allocator_capture cr(stack.result);

				return convert_string_to_number(string_value(c.n, stack.result).c_str());
			}

			case ast_func_number_1:
				return _left->eval_number(c, stack);

			case ast_func_sum:
			{
				xpath_allocator_capture cr(stack.result);

				double r = 0;

				xpath_node_set_raw ns = _left->eval_node_set(c, stack, nodeset_eval_all);

				for (const xpath_node* it = ns.begin(); it != ns.end(); ++it)
				{
					xpath_allocator_capture cri(stack.result);

					r += convert_string_to_number(string_value(*it, stack.result).c_str());
				}

				return r;
			}

			case ast_func_floor:
			{
				double r = _left->eval_number(c, stack);

				return r == r ? floor(r) : r;
			}

			case ast_func_ceiling:
			{
				double r = _left->eval_number(c, stack);

				return r == r ? ceil(r) : r;
			}

			case ast_func_round:
				return round_nearest_nzero(_left->eval_number(c, stack));

			case ast_variable:
			{
				assert(_rettype == _data.variable->type());

				if (_rettype == xpath_type_number)
					return _data.variable->get_number();
			}

			// fallthrough
			default:
			{
				switch (_rettype)
				{
				case xpath_type_boolean:
					return eval_boolean(c, stack) ? 1 : 0;

				case xpath_type_string:
				{
					xpath_allocator_capture cr(stack.result);

					return convert_string_to_number(eval_string(c, stack).c_str());
				}

				case xpath_type_node_set:
				{
					xpath_allocator_capture cr(stack.result);

					return convert_string_to_number(eval_string(c, stack).c_str());
				}

				default:
					assert(false && "Wrong expression for return type number"); // unreachable
					return 0;
				}

			}
			}
		}